

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O2

Yshort ** transpose(Yshort **R,int n)

{
  int iVar1;
  undefined4 *puVar2;
  char *__ptr;
  ulong uVar3;
  Yshort **ppYVar4;
  char *__ptr_00;
  Yshort *pYVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  
  __ptr = allocate(n * 4);
  uVar3 = 0;
  uVar8 = 0;
  if (0 < n) {
    uVar8 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    piVar6 = R[uVar3];
    if (piVar6 != (int *)0x0) {
      for (; -1 < (long)*piVar6; piVar6 = piVar6 + 1) {
        *(int *)(__ptr + (long)*piVar6 * 4) = *(int *)(__ptr + (long)*piVar6 * 4) + 1;
      }
    }
  }
  ppYVar4 = (Yshort **)allocate(n << 3);
  __ptr_00 = allocate(n << 3);
  for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = *(int *)(__ptr + uVar3 * 4);
    if (0 < (long)iVar1) {
      pYVar5 = (Yshort *)allocate(iVar1 * 4 + 4);
      ppYVar4[uVar3] = pYVar5;
      *(Yshort **)(__ptr_00 + uVar3 * 8) = pYVar5;
      pYVar5[iVar1] = -1;
    }
  }
  free(__ptr);
  for (uVar3 = 0; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    piVar6 = R[uVar3];
    if (piVar6 != (int *)0x0) {
      for (; lVar7 = (long)*piVar6, -1 < lVar7; piVar6 = piVar6 + 1) {
        puVar2 = *(undefined4 **)(__ptr_00 + lVar7 * 8);
        *(undefined4 **)(__ptr_00 + lVar7 * 8) = puVar2 + 1;
        *puVar2 = (int)uVar3;
      }
    }
  }
  free(__ptr_00);
  return ppYVar4;
}

Assistant:

Yshort **transpose(Yshort **R, int n)
{
  register Yshort **new_R;
  register Yshort **temp_R;
  register Yshort *nedges;
  register Yshort *sp;
  register int i;
  register int k;

  nedges = NEW2(n, Yshort);

  for (i = 0; i < n; i++)
    {
      sp = R[i];
      if (sp)
	{
	  while (*sp >= 0)
	    nedges[*sp++]++;
	}
    }

  new_R = NEW2(n, Yshort *);
  temp_R = NEW2(n, Yshort *);

  for (i = 0; i < n; i++)
    {
      k = nedges[i];
      if (k > 0)
	{
	  sp = NEW2(k + 1, Yshort);
	  new_R[i] = sp;
	  temp_R[i] = sp;
	  sp[k] = -1;
	}
    }

  FREE(nedges);

  for (i = 0; i < n; i++)
    {
      sp = R[i];
      if (sp)
	{
	  while (*sp >= 0)
	    *temp_R[*sp++]++ = i;
	}
    }

  FREE(temp_R);

  return (new_R);
}